

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerAnalysisFSInv.h
# Opt level: O0

bool dg::pta::PointerAnalysisFSInv::handleInvalidateLocals(PSNode *node,PSNode *pred)

{
  bool bVar1;
  reference where;
  PSNode *pPVar2;
  PSNodeAlloc *this;
  long in_RSI;
  long in_RDI;
  Pointer PVar3;
  PSNodeAlloc *alloc;
  Pointer *ptr;
  const_iterator __end4;
  const_iterator __begin4;
  PointsToSetT *__range4;
  PointsToSetT *S;
  PointsToSetT *predS;
  pair<const_dg::Offset,_dg::pta::PointerIdPointsToSet> *it_1;
  iterator __end3_1;
  iterator __begin3_1;
  MemoryObject *__range3_1;
  pair<const_dg::Offset,_dg::pta::PointerIdPointsToSet> *it;
  iterator __end3;
  iterator __begin3;
  MemoryObject *__range3;
  MemoryObject *pmo;
  MemoryObject *mo;
  pair<dg::pta::PSNode_*const,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>
  *I;
  iterator __end2;
  iterator __begin2;
  MemoryMapT *__range2;
  bool changed;
  MemoryMapT *mm;
  MemoryMapT *pmm;
  MemoryObject *in_stack_fffffffffffffed8;
  PSNode *in_stack_fffffffffffffee0;
  PSNode *in_stack_fffffffffffffee8;
  Offset in_stack_fffffffffffffef0;
  Offset off;
  key_type *in_stack_ffffffffffffff18;
  map<dg::Offset,_dg::pta::PointerIdPointsToSet,_std::less<dg::Offset>,_std::allocator<std::pair<const_dg::Offset,_dg::pta::PointerIdPointsToSet>_>_>
  *in_stack_ffffffffffffff20;
  PointsToSetT *in_stack_ffffffffffffff30;
  PSNode *in_stack_ffffffffffffff38;
  _Self local_98;
  _Self local_90;
  pointer in_stack_ffffffffffffff78;
  _Self local_78;
  _Self local_70;
  MemoryObject *local_68;
  pointer local_60;
  MemoryObject *local_58;
  reference local_50;
  _Self local_48;
  _Self local_40;
  map<dg::pta::PSNode_*,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>,_std::less<dg::pta::PSNode_*>,_std::allocator<std::pair<dg::pta::PSNode_*const,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>_>_>
  *local_38;
  bool local_29;
  map<dg::pta::PSNode_*,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>,_std::less<dg::pta::PSNode_*>,_std::allocator<std::pair<dg::pta::PSNode_*const,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>_>_>
  *local_28;
  map<dg::pta::PSNode_*,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>,_std::less<dg::pta::PSNode_*>,_std::allocator<std::pair<dg::pta::PSNode_*const,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>_>_>
  *local_20;
  long local_10;
  bool local_1;
  
  local_10 = in_RDI;
  local_20 = SubgraphNode<dg::pta::PSNode>::
             getData<std::map<dg::pta::PSNode*,std::unique_ptr<dg::pta::MemoryObject,std::default_delete<dg::pta::MemoryObject>>,std::less<dg::pta::PSNode*>,std::allocator<std::pair<dg::pta::PSNode*const,std::unique_ptr<dg::pta::MemoryObject,std::default_delete<dg::pta::MemoryObject>>>>>>
                       ((SubgraphNode<dg::pta::PSNode> *)(in_RSI + 8));
  if (local_20 ==
      (map<dg::pta::PSNode_*,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>,_std::less<dg::pta::PSNode_*>,_std::allocator<std::pair<dg::pta::PSNode_*const,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>_>_>
       *)0x0) {
    local_1 = false;
  }
  else {
    local_28 = SubgraphNode<dg::pta::PSNode>::
               getData<std::map<dg::pta::PSNode*,std::unique_ptr<dg::pta::MemoryObject,std::default_delete<dg::pta::MemoryObject>>,std::less<dg::pta::PSNode*>,std::allocator<std::pair<dg::pta::PSNode*const,std::unique_ptr<dg::pta::MemoryObject,std::default_delete<dg::pta::MemoryObject>>>>>>
                         ((SubgraphNode<dg::pta::PSNode> *)(local_10 + 8));
    local_29 = false;
    local_38 = local_20;
    local_40._M_node =
         (_Base_ptr)
         std::
         map<dg::pta::PSNode_*,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>,_std::less<dg::pta::PSNode_*>,_std::allocator<std::pair<dg::pta::PSNode_*const,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>_>_>
         ::begin((map<dg::pta::PSNode_*,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>,_std::less<dg::pta::PSNode_*>,_std::allocator<std::pair<dg::pta::PSNode_*const,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>_>_>
                  *)in_stack_fffffffffffffed8);
    local_48._M_node =
         (_Base_ptr)
         std::
         map<dg::pta::PSNode_*,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>,_std::less<dg::pta::PSNode_*>,_std::allocator<std::pair<dg::pta::PSNode_*const,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>_>_>
         ::end((map<dg::pta::PSNode_*,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>,_std::less<dg::pta::PSNode_*>,_std::allocator<std::pair<dg::pta::PSNode_*const,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>_>_>
                *)in_stack_fffffffffffffed8);
    while (bVar1 = std::operator!=(&local_40,&local_48), bVar1) {
      local_50 = std::
                 _Rb_tree_iterator<std::pair<dg::pta::PSNode_*const,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>_>
                 ::operator*((_Rb_tree_iterator<std::pair<dg::pta::PSNode_*const,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>_>
                              *)0x16bb9e);
      bVar1 = isInvalidTarget(local_50->first);
      if (!bVar1) {
        local_58 = getOrCreateMO((MemoryMapT *)in_stack_fffffffffffffef0.offset,
                                 in_stack_fffffffffffffee8);
        local_60 = std::
                   unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>::
                   get((unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>
                        *)0x16bbf2);
        local_68 = local_58;
        local_70._M_node = (_Base_ptr)MemoryObject::begin(in_stack_fffffffffffffed8);
        local_78._M_node = (_Base_ptr)MemoryObject::end(in_stack_fffffffffffffed8);
        while (bVar1 = std::operator!=(&local_70,&local_78), bVar1) {
          where = std::
                  _Rb_tree_iterator<std::pair<const_dg::Offset,_dg::pta::PointerIdPointsToSet>_>::
                  operator*((_Rb_tree_iterator<std::pair<const_dg::Offset,_dg::pta::PointerIdPointsToSet>_>
                             *)0x16bc5c);
          bVar1 = containsRemovableLocals(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
          if (bVar1) {
            replaceLocalsWithInv((PSNode *)where,(PointsToSetT *)in_stack_ffffffffffffff78);
            local_29 = true;
          }
          std::_Rb_tree_iterator<std::pair<const_dg::Offset,_dg::pta::PointerIdPointsToSet>_>::
          operator++((_Rb_tree_iterator<std::pair<const_dg::Offset,_dg::pta::PointerIdPointsToSet>_>
                      *)in_stack_fffffffffffffee0);
        }
        in_stack_ffffffffffffff78 = local_60;
        local_90._M_node = (_Base_ptr)MemoryObject::begin(in_stack_fffffffffffffed8);
        local_98._M_node = (_Base_ptr)MemoryObject::end(in_stack_fffffffffffffed8);
        while (bVar1 = std::operator!=(&local_90,&local_98), bVar1) {
          std::_Rb_tree_iterator<std::pair<const_dg::Offset,_dg::pta::PointerIdPointsToSet>_>::
          operator*((_Rb_tree_iterator<std::pair<const_dg::Offset,_dg::pta::PointerIdPointsToSet>_>
                     *)0x16bd1d);
          bVar1 = PointerIdPointsToSet::empty((PointerIdPointsToSet *)0x16bd46);
          if (!bVar1) {
            pPVar2 = (PSNode *)
                     std::
                     map<dg::Offset,_dg::pta::PointerIdPointsToSet,_std::less<dg::Offset>,_std::allocator<std::pair<const_dg::Offset,_dg::pta::PointerIdPointsToSet>_>_>
                     ::operator[](in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
            PointerIdPointsToSet::begin((PointerIdPointsToSet *)in_stack_fffffffffffffee0);
            PointerIdPointsToSet::end((PointerIdPointsToSet *)in_stack_fffffffffffffee0);
            while (bVar1 = PointerIdPointsToSet::const_iterator::operator!=
                                     ((const_iterator *)in_stack_fffffffffffffee0,
                                      (const_iterator *)in_stack_fffffffffffffed8), bVar1) {
              PVar3 = PointerIdPointsToSet::const_iterator::operator*
                                ((const_iterator *)in_stack_fffffffffffffed8);
              this = PSNodeAlloc::get<dg::pta::PSNode>(in_stack_fffffffffffffee0);
              if ((this == (PSNodeAlloc *)0x0) ||
                 (bVar1 = isLocal((PSNodeAlloc *)in_stack_fffffffffffffef0.offset,
                                  in_stack_fffffffffffffee8), !bVar1)) {
LAB_0016be75:
                bVar1 = PointerIdPointsToSet::add
                                  ((PointerIdPointsToSet *)PVar3.offset.offset.offset,
                                   (Pointer *)PVar3.target);
                local_29 = (local_29 & 1U) != 0 || bVar1;
              }
              else {
                bVar1 = knownInstance((PSNode *)0x16be10);
                off.offset = (type)PVar3.target;
                if (!bVar1) goto LAB_0016be75;
                in_stack_fffffffffffffee0 = pPVar2;
                in_stack_fffffffffffffee8 = INVALIDATED;
                Offset::Offset((Offset *)&stack0xfffffffffffffef0,0);
                bVar1 = PointerIdPointsToSet::add
                                  ((PointerIdPointsToSet *)this,
                                   (PSNode *)in_stack_fffffffffffffef0.offset,off);
                local_29 = (local_29 & 1U) != 0 || bVar1;
              }
              PointerIdPointsToSet::const_iterator::operator++
                        ((const_iterator *)in_stack_fffffffffffffef0.offset);
            }
          }
          std::_Rb_tree_iterator<std::pair<const_dg::Offset,_dg::pta::PointerIdPointsToSet>_>::
          operator++((_Rb_tree_iterator<std::pair<const_dg::Offset,_dg::pta::PointerIdPointsToSet>_>
                      *)in_stack_fffffffffffffee0);
        }
      }
      std::
      _Rb_tree_iterator<std::pair<dg::pta::PSNode_*const,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>_>
      ::operator++((_Rb_tree_iterator<std::pair<dg::pta::PSNode_*const,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>_>
                    *)in_stack_fffffffffffffee0);
    }
    local_1 = (bool)(local_29 & 1);
  }
  return local_1;
}

Assistant:

static bool handleInvalidateLocals(PSNode *node, PSNode *pred) {
        MemoryMapT *pmm = pred->getData<MemoryMapT>();
        if (!pmm) {
            // predecessor was not processed yet
            return false;
        }

        MemoryMapT *mm = node->getData<MemoryMapT>();
        assert(mm && "Node does not have a memory map");

        bool changed = false;
        for (auto &I : *pmm) {
            if (isInvalidTarget(I.first))
                continue;

            // get or create a memory object for this target

            MemoryObject *mo = getOrCreateMO(mm, I.first);
            MemoryObject *pmo = I.second.get();

            for (auto &it : *mo) {
                // remove pointers to locals from the points-to set
                if (containsRemovableLocals(node, it.second)) {
                    replaceLocalsWithInv(node, it.second);
                    assert(!containsRemovableLocals(node, it.second));
                    changed = true;
                }
            }

            for (auto &it : *pmo) {
                PointsToSetT &predS = it.second;
                if (predS.empty())
                    continue;

                PointsToSetT &S = mo->pointsTo[it.first];

                // merge pointers from the previous states
                // but do not include the pointers
                // that _must_ point to destroyed memory
                for (const auto &ptr : predS) {
                    PSNodeAlloc *alloc = PSNodeAlloc::get(ptr.target);
                    if (alloc && isLocal(alloc, node) && knownInstance(alloc)) {
                        changed |= S.add(INVALIDATED, 0);
                    } else
                        changed |= S.add(ptr);
                }

                assert(!S.empty());
            }
        }

        return changed;
    }